

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::register_custom_layer(Net *this,char *type,layer_creator_func creator)

{
  int iVar1;
  reference pvVar2;
  layer_creator_func in_RDX;
  char *in_RSI;
  vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_> *in_RDI;
  layer_registry_entry entry;
  int custom_index;
  int typeindex;
  char *in_stack_ffffffffffffffa8;
  value_type *in_stack_ffffffffffffffb8;
  Net *in_stack_ffffffffffffffc8;
  int local_4;
  
  iVar1 = layer_to_index(in_stack_ffffffffffffffa8);
  if (iVar1 == -1) {
    iVar1 = custom_layer_to_index(in_stack_ffffffffffffffc8,(char *)in_RDI);
    if (iVar1 == -1) {
      std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>::
      push_back(in_RDI,in_stack_ffffffffffffffb8);
    }
    else {
      fprintf(_stderr,"overwrite existing custom layer type %s",in_RSI);
      fprintf(_stderr,"\n");
      pvVar2 = std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
               ::operator[]((vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                             *)&in_RDI[3].
                                super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar1);
      pvVar2->name = in_RSI;
      pvVar2 = std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
               ::operator[]((vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                             *)&in_RDI[3].
                                super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar1);
      pvVar2->creator = in_RDX;
    }
    local_4 = 0;
  }
  else {
    fprintf(_stderr,"can not register build-in layer type %s",in_RSI);
    fprintf(_stderr,"\n");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Net::register_custom_layer(const char* type, layer_creator_func creator)
{
    int typeindex = layer_to_index(type);
    if (typeindex != -1)
    {
        NCNN_LOGE("can not register build-in layer type %s", type);
        return -1;
    }

    int custom_index = custom_layer_to_index(type);
    if (custom_index == -1)
    {
        struct layer_registry_entry entry = { type, creator };
        custom_layer_registry.push_back(entry);
    }
    else
    {
        NCNN_LOGE("overwrite existing custom layer type %s", type);
        custom_layer_registry[custom_index].name = type;
        custom_layer_registry[custom_index].creator = creator;
    }

    return 0;
}